

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O3

bool __thiscall flow::lang::Parser::consumeUntil(Parser *this,Token value)

{
  Token TVar1;
  Lexer *this_00;
  
  this_00 = (this->lexer_)._M_t.
            super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>._M_t.
            super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>.
            super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
  TVar1 = this_00->token_;
  while( true ) {
    if (TVar1 == value) {
      Lexer::nextToken(this_00);
      return true;
    }
    if (TVar1 == Eof) break;
    Lexer::nextToken(this_00);
    this_00 = (this->lexer_)._M_t.
              super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>._M_t
              .super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>.
              super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
    TVar1 = this_00->token_;
  }
  return false;
}

Assistant:

bool Parser::consumeUntil(Token value) {
  for (;;) {
    if (token() == value) {
      nextToken();
      return true;
    }

    if (token() == Token::Eof) return false;

    nextToken();
  }
}